

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

void __thiscall gl4cts::DirectStateAccess::Textures::BufferTest::CleanFramebuffer(BufferTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_fbo != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_rbo != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x460))(1,&this->m_rbo);
    this->m_rbo = 0;
  }
  return;
}

Assistant:

void BufferTest::CleanFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Framebuffer. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	/* Renderbuffer. */
	if (m_rbo)
	{
		gl.deleteRenderbuffers(1, &m_rbo);

		m_rbo = 0;
	}
}